

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intraprocess_publisher_link.cpp
# Opt level: O1

void __thiscall miniros::IntraProcessPublisherLink::drop(IntraProcessPublisherLink *this)

{
  recursive_mutex *__mutex;
  int iVar1;
  element_type *peVar2;
  Subscription *this_00;
  Level level;
  void *logger_handle;
  int iVar3;
  string *psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  bool bVar6;
  string local_48;
  
  __mutex = &this->drop_mutex_;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  if (this->dropped_ != false) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  this->dropped_ = true;
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  peVar2 = (this->publisher_).
           super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar2 != (element_type *)0x0) {
    (*(peVar2->super_SubscriberLink)._vptr_SubscriberLink[3])();
    p_Var5 = (this->publisher_).
             super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->publisher_).
    super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->publisher_).
    super___shared_ptr<miniros::IntraProcessSubscriberLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
  }
  p_Var5 = (this->super_PublisherLink).parent_.
           super___weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = p_Var5->_M_use_count;
    do {
      if (iVar3 == 0) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = p_Var5->_M_use_count;
      bVar6 = iVar3 == iVar1;
      if (bVar6) {
        p_Var5->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar6);
  }
  if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar6 = true;
  }
  else {
    bVar6 = p_Var5->_M_use_count == 0;
  }
  this_00 = (this->super_PublisherLink).parent_.
            super___weak_ptr<miniros::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (!(bool)(this_00 == (Subscription *)0x0 | bVar6)) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (drop::loc.initialized_ == false) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"miniros.intraprocess_publisher_link","");
      console::initializeLogLocation(&drop::loc,&local_48,Debug);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    if (drop::loc.level_ != Debug) {
      console::setLogLocationLevel(&drop::loc,Debug);
      console::checkLogLocationEnabled(&drop::loc);
    }
    logger_handle = drop::loc.logger_;
    level = drop::loc.level_;
    if (drop::loc.logger_enabled_ == true) {
      psVar4 = Subscription::getName_abi_cxx11_(this_00);
      console::print((FilterBase *)0x0,logger_handle,level,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/intraprocess_publisher_link.cpp"
                     ,0x65,"virtual void miniros::IntraProcessPublisherLink::drop()",
                     "Connection to local publisher on topic [%s] dropped",
                     (psVar4->_M_dataplus)._M_p);
    }
    std::__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<miniros::PublisherLink,void>
              ((__shared_ptr<miniros::PublisherLink,(__gnu_cxx::_Lock_policy)2> *)&local_48,
               (__weak_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_PublisherLink).super_enable_shared_from_this<miniros::PublisherLink>);
    Subscription::removePublisherLink(this_00,(PublisherLinkPtr *)&local_48);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_string_length);
    }
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  return;
}

Assistant:

void IntraProcessPublisherLink::drop()
{
  {
    std::scoped_lock<std::recursive_mutex> lock(drop_mutex_);
    if (dropped_)
    {
      return;
    }

    dropped_ = true;
  }

  if (publisher_)
  {
    publisher_->drop();
    publisher_.reset();
  }

  if (SubscriptionPtr parent = parent_.lock())
  {
    MINIROS_DEBUG("Connection to local publisher on topic [%s] dropped", parent->getName().c_str());

    parent->removePublisherLink(shared_from_this());
  }
}